

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_ru_u_row_access<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
               (void)

{
  pool<boost::default_user_allocator_malloc_free> *ppVar1;
  mapped_type *pmVar2;
  _Rb_tree_node_base *p_Var3;
  int iVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *r;
  pointer witness;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  column_content<typename_Matrix<RU_rep_options_with_row_access<true,_(Column_types)7,_true,_false,_false,_true,_false,_true>_>::Column>
  orderedRows;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  rows;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>
  m;
  allocator_type local_209;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_208;
  undefined8 local_1d4;
  undefined4 local_1cc;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_1c8;
  witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>
  *local_1b0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_1a8;
  pool<boost::default_user_allocator_malloc_free> *local_190;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>
  local_188;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>>
            ();
  local_190 = (pool<boost::default_user_allocator_malloc_free> *)operator_new(0x38);
  (((Entry_constructor *)&local_190->super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (local_190->list).ptr = (char *)0x0;
  (local_190->list).sz = 0;
  local_190->requested_size = 0x20;
  local_190->next_size = 0x20;
  local_190->start_size = 0x20;
  local_190->max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
              *)&local_188,&local_1a8,(Column_settings *)local_190);
  local_1c8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>
        *)0x0;
  local_1c8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>
        *)0x0;
  local_1c8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d4 = (ulong)local_1d4._4_4_ << 0x20;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_1d4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208,__l,&local_209);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_1c8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208);
  if ((pointer)local_208._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._M_impl._0_8_,
                    (long)local_208._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_208._M_impl._0_8_);
  }
  local_1d4 = CONCAT44(local_1d4._4_4_,1);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_1d4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208,__l_00,&local_209);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_1c8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208);
  if ((pointer)local_208._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._M_impl._0_8_,
                    (long)local_208._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_208._M_impl._0_8_);
  }
  local_1d4 = CONCAT44(local_1d4._4_4_,2);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_1d4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208,__l_01,&local_209);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_1c8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208);
  if ((pointer)local_208._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._M_impl._0_8_,
                    (long)local_208._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_208._M_impl._0_8_);
  }
  local_1d4 = CONCAT44(local_1d4._4_4_,3);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_1d4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208,__l_02,&local_209);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_1c8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208);
  if ((pointer)local_208._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._M_impl._0_8_,
                    (long)local_208._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_208._M_impl._0_8_);
  }
  local_1d4 = CONCAT44(local_1d4._4_4_,4);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&local_1d4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208,__l_03,&local_209);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_1c8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208);
  if ((pointer)local_208._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._M_impl._0_8_,
                    (long)local_208._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_208._M_impl._0_8_);
  }
  local_1d4 = 0x400000003;
  local_1cc = 5;
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)&local_1d4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208,__l_04,&local_209);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_1c8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208);
  if ((pointer)local_208._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._M_impl._0_8_,
                    (long)local_208._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_208._M_impl._0_8_);
  }
  local_1d4 = CONCAT44(local_1d4._4_4_,6);
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&local_1d4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208,__l_05,&local_209);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_1c8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208);
  if ((pointer)local_208._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._M_impl._0_8_,
                    (long)local_208._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_208._M_impl._0_8_);
  }
  local_208._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&local_208 + 8);
  local_208._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  iVar4 = 0;
  local_208._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_208._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1b0 = local_1c8.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_208._M_impl.super__Rb_tree_header._M_header._M_right =
       local_208._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_1c8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1c8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    witness = local_1c8.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::clear(&local_208);
      local_1d4 = CONCAT44(local_1d4._4_4_,iVar4);
      pmVar2 = std::
               map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>_>_>_>_>
               ::at(local_188.mirrorMatrixU_.super_Matrix_row_access_option.rows_,
                    (key_type *)&local_1d4);
      for (p_Var3 = (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        local_1d4._4_4_ = (uint)((ulong)local_1d4 >> 0x20);
        local_1d4 = CONCAT44(local_1d4._4_4_,p_Var3[1]._M_color);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_insert_unique<unsigned_int>(&local_208,(uint *)&local_1d4);
      }
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>>
                (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>
                          *)&local_208);
      iVar4 = iVar4 + 1;
      witness = witness + 1;
    } while (witness != local_1b0);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_208);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_1c8);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>
  ::reset(&local_188,(Column_settings *)local_190);
  ppVar1 = local_190;
  if (local_190 != (pool<boost::default_user_allocator_malloc_free> *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory(local_190);
  }
  operator_delete(ppVar1,0x38);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>
  ::~RU_matrix(&local_188);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_1a8);
  return;
}

Assistant:

void test_ru_u_row_access() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  std::vector<witness_content<typename Matrix::Column> > rows;
  if constexpr (Matrix::Option_list::is_z2) {
    rows.push_back({0});
    rows.push_back({1});
    rows.push_back({2});
    rows.push_back({3});
    rows.push_back({4});
    rows.push_back({3, 4, 5});
    rows.push_back({6});
  } else {
    rows.push_back({{0, 1}});
    rows.push_back({{1, 1}});
    rows.push_back({{2, 1}});
    rows.push_back({{3, 1}, {5, 4}});
    rows.push_back({{4, 1}, {5, 4}});
    rows.push_back({{5, 1}});
    rows.push_back({{6, 1}});
  }

  column_content<typename Matrix::Column> orderedRows;
  unsigned int i = 0;
  for (auto& r : rows) {
    orderedRows.clear();
    for (const auto& entry : m.get_row(i++, false)) {
      if constexpr (Matrix::Option_list::is_z2) {
        orderedRows.insert(entry.get_column_index());
      } else {
        orderedRows.insert({entry.get_column_index(), entry.get_element()});
      }
    }
    test_column_equality<typename Matrix::Column>(r, orderedRows);
  }
}